

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::ToString(SQVM *this,SQObjectPtr *o,SQObjectPtr *res)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  SQSharedState *this_00;
  bool bVar3;
  int iVar4;
  SQChar *pSVar5;
  SQChar *pSVar6;
  SQString *x;
  SQMetaMethod mm;
  char *__format;
  byte unaff_BPL;
  SQObjectPtr closure;
  
  SVar1 = (o->super_SQObject)._type;
  if (SVar1 == OT_BOOL) {
    pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,6);
    __format = "true";
    if ((o->super_SQObject)._unVal.pTable == (SQTable *)0x0) {
      __format = "false";
    }
    snprintf(pSVar5,6,__format);
LAB_0012976e:
    this_00 = this->_sharedstate;
    pSVar5 = SQSharedState::GetScratchPad(this_00,-1);
    x = SQString::Create(this_00,pSVar5,-1);
    SQObjectPtr::operator=(res,x);
  }
  else {
    if (SVar1 == OT_INTEGER) {
      pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
      snprintf(pSVar5,0x32,"%lld",(o->super_SQObject)._unVal.pTable);
      goto LAB_0012976e;
    }
    if (SVar1 == OT_FLOAT) {
      pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
      snprintf(pSVar5,0x32,"%g",(double)(o->super_SQObject)._unVal.fFloat);
      goto LAB_0012976e;
    }
    if (((SVar1 == OT_INSTANCE) || (SVar1 == OT_TABLE)) || (SVar1 == OT_USERDATA)) {
      pSVar2 = (o->super_SQObject)._unVal.pTable;
      if ((pSVar2->super_SQDelegable)._delegate != (SQTable *)0x0) {
        closure.super_SQObject._type = OT_NULL;
        closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
        iVar4 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _vptr_SQRefCounted[6])(pSVar2,this,0xf);
        if ((char)iVar4 == '\0') {
LAB_00129689:
          bVar3 = true;
        }
        else {
          Push(this,o);
          bVar3 = CallMetaMethod(this,&closure,mm,1,res);
          if (bVar3) {
            if ((res->super_SQObject)._type != OT_STRING) goto LAB_00129689;
            unaff_BPL = 1;
          }
          else {
            unaff_BPL = 0;
          }
          bVar3 = false;
        }
        SQObjectPtr::~SQObjectPtr(&closure);
        if (!bVar3) goto LAB_001297a0;
      }
LAB_00129735:
      pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,0x42);
      pSVar6 = GetTypeName(o);
      snprintf(pSVar5,0x42,"(%s : 0x%p)",pSVar6,(o->super_SQObject)._unVal.pTable);
      goto LAB_0012976e;
    }
    if (SVar1 != OT_STRING) goto LAB_00129735;
    SQObjectPtr::operator=(res,o);
  }
  unaff_BPL = 1;
LAB_001297a0:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool SQVM::ToString(const SQObjectPtr &o,SQObjectPtr &res)
{
    switch(sq_type(o)) {
    case OT_STRING:
        res = o;
        return true;
    case OT_FLOAT:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_SC("%g"),_float(o));
        break;
    case OT_INTEGER:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_PRINT_INT_FMT,_integer(o));
        break;
    case OT_BOOL:
        scsprintf(_sp(sq_rsl(6)),sq_rsl(6),_integer(o)?_SC("true"):_SC("false"));
        break;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_TOSTRING, closure)) {
                Push(o);
                if(CallMetaMethod(closure,MT_TOSTRING,1,res)) {
                    if(sq_type(res) == OT_STRING)
                        return true;
                }
                else {
                    return false;
                }
            }
        }
    default:
        scsprintf(_sp(sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR)),sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR),_SC("(%s : 0x%p)"),GetTypeName(o),(void*)_rawval(o));
    }
    res = SQString::Create(_ss(this),_spval);
    return true;
}